

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

char * describeLookahead(char *formatstring,char *s)

{
  char *pcVar1;
  char *s_local;
  char *formatstring_local;
  
  if (lookahead == 0x193) {
    pcVar1 = lexString(tokenval);
    sprintf(formatstring,"%s\"%s\"",s,pcVar1);
  }
  else if (lookahead == 0x191) {
    sprintf(formatstring,"%s%d",s,(ulong)(uint)tokenval);
  }
  else if (lookahead == 0x192) {
    sprintf(formatstring,"%s%g",(double)realtokval,s);
  }
  else if (lookahead == 400) {
    sprintf(formatstring,"%sNOT",s);
  }
  else if (lookahead == 0x194) {
    sprintf(formatstring,"%sWITHIN",s);
  }
  else if (lookahead == 0x195) {
    sprintf(formatstring,"%s(end of pattern)",s);
  }
  else {
    sprintf(formatstring,"%s\'%c\'",s,(ulong)(uint)lookahead);
  }
  return formatstring;
}

Assistant:

char* describeLookahead(char formatstring[], char *s) {

   if (lookahead == ID_TOK) {
     sprintf(formatstring,"%s\"%s\"", s, lexString(tokenval));
   }
   else if (lookahead == NUM_TOK) {
     sprintf(formatstring,"%s%d", s, tokenval);
   }
   else if (lookahead == REALNUM_TOK) {
     sprintf(formatstring,"%s%g", s, realtokval);
   }
   else if (lookahead == NOT_TOK) {
     sprintf(formatstring,"%sNOT", s);
   }
   else if (lookahead == WITHIN_TOK) {
     sprintf(formatstring,"%sWITHIN", s);
   }
   else if (lookahead == DONE_TOK) {
     sprintf(formatstring,"%s(end of pattern)", s);
   }
   else {
     sprintf(formatstring,"%s\'%c\'", s, lookahead);
   }
   return formatstring;
}